

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.c
# Opt level: O1

double getVariableValue(char *key)

{
  variable **ppvVar1;
  int iVar2;
  variable *pvVar3;
  
  pvVar3 = variables_first;
  if (variables_first != (variable *)0x0) {
    do {
      iVar2 = strcmp(key,pvVar3->key);
      if (iVar2 == 0) {
        return pvVar3->value;
      }
      ppvVar1 = &pvVar3->next;
      pvVar3 = *ppvVar1;
    } while (*ppvVar1 != (variable *)0x0);
  }
  return 0.0;
}

Assistant:

double getVariableValue(const char *key)
{
    struct variable *var = variables_first;

    while (var != NULL) {
        if (!strcmp(key, var->key)) {
            return var->value;
        }

        var = var->next;
    }

    return 0;
}